

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::relax(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  double dVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  cpp_dec_float<50U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined8 local_d8;
  uint auStack_d0 [4];
  undefined5 uStack_c0;
  undefined3 uStack_bb;
  undefined5 local_b8;
  undefined3 uStack_b3;
  int local_b0;
  undefined1 local_ac;
  undefined8 local_a8;
  cpp_dec_float<50U,_int,_void> local_98;
  cpp_dec_float<50U,_int,_void> local_58;
  
  peVar2 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar1 = peVar2->s_epsilon_multiplier;
  uVar3 = -(ulong)(dVar1 == 1.0);
  local_a8._0_4_ = cpp_dec_float_finite;
  local_a8._4_4_ = 10;
  local_d8._0_4_ = 0;
  local_d8._4_4_ = 0;
  auStack_d0[0] = 0;
  auStack_d0[1] = 0;
  auStack_d0[2] = 0;
  auStack_d0[3] = 0;
  uStack_c0 = 0;
  uStack_bb = 0;
  local_b8 = 0;
  uStack_b3 = 0;
  local_b0 = 0;
  local_ac = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_d8,
             (double)(~uVar3 & (ulong)(dVar1 * 1e-05) | uVar3 & 0x3ee4f8b588e368f1));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_98.fpclass = cpp_dec_float_finite;
  local_98.prec_elem = 10;
  local_98.data._M_elems[0] = 0;
  local_98.data._M_elems[1] = 0;
  local_98.data._M_elems[2] = 0;
  local_98.data._M_elems[3] = 0;
  local_98.data._M_elems[4] = 0;
  local_98.data._M_elems[5] = 0;
  local_98.data._M_elems._24_5_ = 0;
  local_98.data._M_elems[7]._1_3_ = 0;
  local_98.data._M_elems._32_5_ = 0;
  local_98._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_98,0.95);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&(this->minStab).m_backend,&local_98);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_98,3,(type *)0x0);
  local_58.data._M_elems[9]._1_3_ = uStack_b3;
  local_58.data._M_elems._32_5_ = local_b8;
  local_58.data._M_elems[7]._1_3_ = uStack_bb;
  local_58.data._M_elems._24_5_ = uStack_c0;
  local_58.data._M_elems[4] = auStack_d0[2];
  local_58.data._M_elems[5] = auStack_d0[3];
  local_58.data._M_elems[0] = (uint)local_d8;
  local_58.data._M_elems[1] = local_d8._4_4_;
  local_58.data._M_elems[2] = auStack_d0[0];
  local_58.data._M_elems[3] = auStack_d0[1];
  local_58.exp = local_b0;
  local_58.neg = (bool)local_ac;
  local_58.fpclass = (fpclass_type)local_a8;
  local_58.prec_elem = local_a8._4_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_58,&local_98);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(this->fastDelta).m_backend,&local_58);
  return;
}

Assistant:

void SPxFastRT<R>::relax()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   minStab *= 0.95;
   fastDelta += 3 * delta_shift;
}